

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O0

void __thiscall test_suite::detail::suite_list::insert(suite_list *this,suite_info inf)

{
  size_t sVar1;
  length_error *this_00;
  suite_list *this_local;
  suite_info inf_local;
  
  if (this->count_ == 0x100) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"too many test suites");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  sVar1 = this->count_;
  this->count_ = sVar1 + 1;
  this->data_[sVar1].name = inf.name;
  this->data_[sVar1].run = inf.run;
  return;
}

Assistant:

void
  insert(suite_info inf)
  {
#ifndef BOOST_NO_EXCEPTIONS
    if(count_ == max_size_)
      throw std::length_error(
          "too many test suites");
#endif
    data_[count_++] = inf;
  }